

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-form.c
# Opt level: O3

size_t vstrnfmt(char *buf,size_t max,char *fmt,__va_list_tag *vp)

{
  byte *pbVar1;
  long lVar2;
  char cVar3;
  uint uVar4;
  undefined8 *puVar5;
  ushort **ppuVar6;
  uint *puVar7;
  long *plVar8;
  size_t sVar9;
  ulong uVar10;
  uint uVar11;
  char *buf_00;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  int *s;
  byte bVar15;
  size_t sVar16;
  bool bVar17;
  char aux [128];
  char tmp [1024];
  char arg2 [1024];
  undefined8 local_8c0;
  byte local_8b8 [128];
  char local_838;
  char local_837 [1023];
  char local_438 [1032];
  
  if (max == 0) {
    __assert_fail("max",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-form.c"
                  ,0xcd,"size_t vstrnfmt(char *, size_t, const char *, struct __va_list_tag *)");
  }
  if (fmt == (char *)0x0) {
    __assert_fail("fmt",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-form.c"
                  ,0xce,"size_t vstrnfmt(char *, size_t, const char *, struct __va_list_tag *)");
  }
  local_8c0 = max - 1;
  sVar16 = 0;
LAB_00212aad:
  do {
    for (fmt = (char *)((byte *)fmt + 1); bVar15 = ((byte *)fmt)[-1], bVar15 == 0x25;
        fmt = (char *)((byte *)fmt + 2)) {
      bVar15 = *fmt;
      if (bVar15 != 0x6e) {
        if (bVar15 != 0x25) {
          local_8b8[0] = 0x25;
          if (bVar15 == 0) goto switchD_00212c3a_default;
          uVar14 = 1;
          bVar17 = false;
          ppuVar6 = __ctype_b_loc();
          goto LAB_00212b62;
        }
        sVar9 = local_8c0;
        if (sVar16 == local_8c0) goto switchD_00212c3a_caseD_68;
        buf[sVar16] = '%';
        sVar16 = sVar16 + 1;
        fmt = (char *)((byte *)fmt + 1);
        goto LAB_00212aad;
      }
      uVar11 = vp->gp_offset;
      if ((ulong)uVar11 < 0x29) {
        puVar5 = (undefined8 *)((ulong)uVar11 + (long)vp->reg_save_area);
        vp->gp_offset = uVar11 + 8;
      }
      else {
        puVar5 = (undefined8 *)vp->overflow_arg_area;
        vp->overflow_arg_area = puVar5 + 1;
      }
      *(size_t *)*puVar5 = sVar16;
    }
    sVar9 = sVar16;
    if ((bVar15 == 0) || (sVar9 = local_8c0, sVar16 == local_8c0)) goto switchD_00212c3a_caseD_68;
    buf[sVar16] = bVar15;
    sVar16 = sVar16 + 1;
  } while( true );
LAB_00212b62:
  if (100 < uVar14) goto switchD_00212c3a_default;
  if ((*(byte *)((long)*ppuVar6 + (ulong)bVar15 * 2 + 1) & 4) == 0) {
    if (bVar15 != 0x2a) goto LAB_00212ba8;
    uVar11 = vp->gp_offset;
    if ((ulong)uVar11 < 0x29) {
      puVar7 = (uint *)((ulong)uVar11 + (long)vp->reg_save_area);
      vp->gp_offset = uVar11 + 8;
    }
    else {
      puVar7 = (uint *)vp->overflow_arg_area;
      vp->overflow_arg_area = puVar7 + 2;
    }
    snprintf((char *)(local_8b8 + uVar14),0x80 - uVar14,"%d",(ulong)*puVar7);
    uVar14 = uVar14 - 1;
    do {
      lVar2 = uVar14 + 1;
      uVar14 = uVar14 + 1;
    } while (local_8b8[lVar2] != 0);
  }
  else {
    if (bVar15 != 0x6c) goto LAB_00212c02;
    bVar17 = true;
    bVar15 = 0x6c;
LAB_00212ba8:
    local_8b8[uVar14] = bVar15;
    uVar14 = uVar14 + 1;
  }
  bVar15 = ((byte *)fmt)[1];
  fmt = (char *)((byte *)fmt + 1);
  if (bVar15 == 0) goto switchD_00212c3a_default;
  goto LAB_00212b62;
LAB_00212c02:
  local_8b8[uVar14] = bVar15;
  local_8b8[uVar14 + 1] = 0;
  local_838 = '\0';
  if (bVar15 < 99) {
    if ((bVar15 == 0x45) || (bVar15 == 0x47)) goto switchD_00212c3a_caseD_65;
    sVar9 = 0;
    if (bVar15 != 0x58) goto switchD_00212c3a_caseD_68;
switchD_00212c3a_caseD_64:
    uVar11 = vp->gp_offset;
    if (bVar17) {
      if (uVar11 < 0x29) {
        puVar5 = (undefined8 *)((ulong)uVar11 + (long)vp->reg_save_area);
        vp->gp_offset = uVar11 + 8;
      }
      else {
        puVar5 = (undefined8 *)vp->overflow_arg_area;
        vp->overflow_arg_area = puVar5 + 1;
      }
      buf_00 = (char *)*puVar5;
      goto LAB_00212dc2;
    }
    if (uVar11 < 0x29) {
      puVar7 = (uint *)((ulong)uVar11 + (long)vp->reg_save_area);
      vp->gp_offset = uVar11 + 8;
    }
    else {
      puVar7 = (uint *)vp->overflow_arg_area;
      vp->overflow_arg_area = puVar7 + 2;
    }
    uVar11 = *puVar7;
LAB_00212de5:
    snprintf(&local_838,0x400,(char *)local_8b8,(ulong)uVar11);
  }
  else {
    sVar9 = 0;
    switch(bVar15) {
    case 99:
      uVar11 = vp->gp_offset;
      if ((ulong)uVar11 < 0x29) {
        puVar7 = (uint *)((ulong)uVar11 + (long)vp->reg_save_area);
        vp->gp_offset = uVar11 + 8;
      }
      else {
        puVar7 = (uint *)vp->overflow_arg_area;
        vp->overflow_arg_area = puVar7 + 2;
      }
      uVar11 = *puVar7;
      goto LAB_00212de5;
    case 100:
    case 0x69:
    case 0x6f:
    case 0x75:
    case 0x78:
      goto switchD_00212c3a_caseD_64;
    case 0x65:
    case 0x66:
    case 0x67:
switchD_00212c3a_caseD_65:
      uVar11 = vp->fp_offset;
      if ((ulong)uVar11 < 0xa1) {
        puVar5 = (undefined8 *)((ulong)uVar11 + (long)vp->reg_save_area);
        vp->fp_offset = uVar11 + 0x10;
      }
      else {
        puVar5 = (undefined8 *)vp->overflow_arg_area;
        vp->overflow_arg_area = puVar5 + 1;
      }
      snprintf(&local_838,0x400,(char *)local_8b8,*puVar5);
      goto LAB_00212df6;
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x76:
    case 0x77:
      goto switchD_00212c3a_caseD_68;
    case 0x70:
      uVar11 = vp->gp_offset;
      if ((ulong)uVar11 < 0x29) {
        puVar5 = (undefined8 *)((ulong)uVar11 + (long)vp->reg_save_area);
        vp->gp_offset = uVar11 + 8;
      }
      else {
        puVar5 = (undefined8 *)vp->overflow_arg_area;
        vp->overflow_arg_area = puVar5 + 1;
      }
      buf_00 = (char *)*puVar5;
      break;
    case 0x73:
      if (bVar17) {
        uVar11 = vp->gp_offset;
        if ((ulong)uVar11 < 0x29) {
          plVar8 = (long *)((ulong)uVar11 + (long)vp->reg_save_area);
          vp->gp_offset = uVar11 + 8;
        }
        else {
          plVar8 = (long *)vp->overflow_arg_area;
          vp->overflow_arg_area = plVar8 + 1;
        }
        s = (int *)*plVar8;
        if (s == (wchar_t *)0x0) {
          s = anon_var_dwarf_1f1143;
        }
        sVar9 = text_wcslen(s);
        uVar4 = (uint)sVar9;
        uVar11 = 0x2ff;
        if ((int)uVar4 < 0x2ff) {
          uVar11 = uVar4;
        }
        if (0 < (int)uVar4) {
          uVar10 = 1;
          if (1 < (int)uVar11) {
            uVar10 = (ulong)uVar11;
          }
          uVar13 = 0;
          do {
            local_438[uVar13] = (char)s[uVar13];
            uVar13 = uVar13 + 1;
          } while (uVar10 != uVar13);
        }
        local_438[(int)uVar11] = '\0';
        pbVar1 = local_8b8 + (uVar14 - 1);
        pbVar1[0] = 0x73;
        pbVar1[1] = 0;
        snprintf(&local_838,0x400,(char *)local_8b8,local_438);
        goto LAB_00212df6;
      }
      uVar11 = vp->gp_offset;
      if ((ulong)uVar11 < 0x29) {
        plVar8 = (long *)((ulong)uVar11 + (long)vp->reg_save_area);
        vp->gp_offset = uVar11 + 8;
      }
      else {
        plVar8 = (long *)vp->overflow_arg_area;
        vp->overflow_arg_area = plVar8 + 1;
      }
      pcVar12 = (char *)*plVar8;
      if (pcVar12 == (char *)0x0) {
        pcVar12 = "";
      }
      buf_00 = local_438;
      my_strcpy(buf_00,pcVar12,0x400);
      break;
    default:
switchD_00212c3a_default:
      sVar9 = 0;
switchD_00212c3a_caseD_68:
      buf[sVar9] = '\0';
      return sVar9;
    }
LAB_00212dc2:
    snprintf(&local_838,0x400,(char *)local_8b8,buf_00);
  }
LAB_00212df6:
  fmt = (char *)((byte *)fmt + 1);
  pcVar12 = local_837;
  sVar9 = sVar16;
  cVar3 = local_838;
  if (sVar16 != local_8c0 && local_838 != '\0') {
    do {
      sVar16 = sVar9 + 1;
      buf[sVar9] = cVar3;
      cVar3 = *pcVar12;
      if (cVar3 == '\0') break;
      pcVar12 = pcVar12 + 1;
      bVar17 = max - 2 != sVar9;
      sVar9 = sVar16;
    } while (bVar17);
  }
  goto LAB_00212aad;
}

Assistant:

size_t vstrnfmt(char *buf, size_t max, const char *fmt, va_list vp)
{
	const char *s;
	int i = 0, len = 0;

	/* The argument is "long" */
	bool do_long;

	/* Bytes used in buffer */
	size_t n;

	/* Bytes used in format sequence */
	size_t q;

	/* Format sequence */
	char aux[128];

	/* Resulting string */
	char tmp[1024];

	assert(max);
	assert(fmt);

	/* Begin the buffer */
	n = 0;

	/* Begin the format string */
	s = fmt;

	/* Scan the format string */
	while (true) {
		/* All done */
		if (!*s) break;

		/* Normal character */
		if (*s != '%') {
			/* Check total length */
			if (n == max-1) break;

			/* Save the character */
			buf[n++] = *s++;

			/* Continue */
			continue;
		}

		/* Skip the "percent" */
		s++;

		/* Pre-process "%%" */
		if (*s == '%') {
			/* Check total length */
			if (n == max-1) break;

			/* Save the percent */
			buf[n++] = '%';

			/* Skip the "%" */
			s++;

			/* Continue */
			continue;
		}

		/* Pre-process "%n" */
		if (*s == 'n') {
			size_t *arg;

			/* Get the next argument */
			arg = va_arg(vp, size_t *);

			/* Save the current length */
			(*arg) = n;

			/* Skip the "n" */
			s++;

			/* Continue */
			continue;
		}


		/* Begin the "aux" string */
		q = 0;

		/* Save the "percent" */
		aux[q++] = '%';

		do_long = false;

		/* Build the "aux" string */
		while (true) {
			/* Error -- format sequence is not terminated */
			if (!*s) {
				/* Terminate the buffer */
				buf[0] = '\0';

				/* Return "error" */
				return (0);
			}

			/* Error -- format sequence may be too long */
			if (q > 100) {
				/* Terminate the buffer */
				buf[0] = '\0';

				/* Return "error" */
				return (0);
			}

			/* Handle "alphabetic" or "non-alphabetic"chars */
			if (isalpha((unsigned char)*s)) {
				/* Hack -- handle "long" request */
				if (*s == 'l') {
					/* Save the character */
					aux[q++] = *s++;

					/* Note the "long" flag */
					do_long = true;
				} else {
					/* Save the character */
					aux[q++] = *s++;

					/* Stop processing the format sequence */
					break;
				}
			} else {
				/* Hack -- Handle 'star' (for "variable length" argument) */
				if (*s == '*') {
					int arg;

					/* Get the next argument */
					arg = va_arg(vp, int);

					/* Hack -- append the "length" */
					snprintf(aux + q, sizeof(aux) - q, "%d", arg);

					/* Hack -- accept the "length" */
					while (aux[q]) q++;

					/* Skip the "*" */
					s++;
				} else {
					/* Save the normal character (digits, "-", "+", ".", etc) */
					aux[q++] = *s++;
				}
			}
		}

		/* Terminate "aux" */
		aux[q] = '\0';

		/* Clear "tmp" */
		tmp[0] = '\0';

		/* Process the "format" symbol */
		switch (aux[q - 1]) {
			/* Simple Character -- standard format */
			case 'c':
			{
				int arg;

				/* Get the next argument */
				arg = va_arg(vp, int);

				/* Format the argument */
				snprintf(tmp, sizeof(tmp), aux, arg);

				/* Done */
				break;
			}

			/* Signed Integers -- standard format */
			case 'd': case 'i':
			{
				if (do_long) {
					long arg;

					/* Get the next argument */
					arg = va_arg(vp, long);

					/* Format the argument */
					snprintf(tmp, sizeof(tmp), aux, arg);
				} else {
					int arg;

					/* Get the next argument */
					arg = va_arg(vp, int);

					/* Format the argument */
					snprintf(tmp, sizeof(tmp), aux, arg);
				}

				/* Done */
				break;
			}

			/* Unsigned Integers -- various formats */
			case 'u': case 'o': case 'x': case 'X':
			{
				if (do_long) {
					unsigned long arg;

					/* Get the next argument */
					arg = va_arg(vp, unsigned long);

					/* Format the argument */
					snprintf(tmp, sizeof(tmp), aux, arg);
				} else {
					unsigned int arg;

					/* Get the next argument */
					arg = va_arg(vp, unsigned int);

					/* Format the argument */
					snprintf(tmp, sizeof(tmp), aux, arg);
				}

				/* Done */
				break;
			}

			/* Floating Point -- various formats */
			case 'f':
			case 'e': case 'E':
			case 'g': case 'G':
			{
				double arg;

				/* Get the next argument */
				arg = va_arg(vp, double);

				/* Format the argument */
				snprintf(tmp, sizeof(tmp), aux, arg);

				/* Done */
				break;
			}

			/* Pointer -- implementation varies */
			case 'p':
			{
				void *arg;

				/* Get the next argument */
				arg = va_arg(vp, void*);

				/* Format the argument */
				snprintf(tmp, sizeof(tmp), aux, arg);

				/* Done */
				break;
			}

			/* String */
			case 's':
			{
				if (do_long) {
					const wchar_t *arg;
					char arg2[1024];

					/* XXX There is a big bug here: if one
					 * passes "%.0s" to strnfmt, then really we
					 * should not dereference the arg at all.
					 * But it does.  See bug #666.
					 */

					/* Get the next argument */
					arg = va_arg(vp, const wchar_t *);

					/* Hack -- convert NULL to EMPTY */
					if (!arg) arg = L"";

					/* Prevent buffer overflows and convert string to char */
					/* this really should use a wcstombs type function */
					len = text_wcslen(arg);
					if (len >= 768) {
						len = 767;
					}
					for (i = 0; i < len; ++i) {
						arg2[i] = (char)arg[i];
					}
					arg2[len] = '\0';

					/* Remove the l from aux, since we no longer have wchar_t
					 * as input */
					aux[q-2] = 's';
					aux[q-1] = '\0';

					/* Format the argument */
					snprintf(tmp, sizeof(tmp), aux, arg2);

					/* Done */
					break;
				} else {
					const char *arg;
					char arg2[1024];

					/* XXX There is a big bug here: if one
					 * passes "%.0s" to strnfmt, then really we
					 * should not dereference the arg at all.
					 * But it does.  See bug #666.
					 */

					/* Get the next argument */
					arg = va_arg(vp, const char *);

					/* Hack -- convert NULL to EMPTY */
					if (!arg) arg = "";

					/* Prevent buffer overflows */
					(void)my_strcpy(arg2, arg, sizeof(arg2));

					/* Format the argument */
					snprintf(tmp, sizeof(tmp), aux, arg2);

					/* Done */
					break;
				}
			}

			/* Oops */
			default:
			{
				/* Error -- illegal format char */
				buf[0] = '\0';

				/* Return "error" */
				return (0);
			}
		}

		/* Now append "tmp" to "buf" */
		for (q = 0; tmp[q]; q++) {
			/* Check total length */
			if (n == max-1) break;

			/* Save the character */
			buf[n++] = tmp[q];
		}
	}


	/* Terminate buffer */
	buf[n] = '\0';

	/* Return length */
	return (n);
}